

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O0

void __thiscall cp::PlanFootprints::calcNextFootprintOld(PlanFootprints *this)

{
  Scalar SVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *pDVar8;
  QuaternionBase<Eigen::Quaternion<double,0>> *this_00;
  double dVar9;
  Scalar local_180;
  Scalar local_168;
  Scalar local_150;
  Quaternion<double,_0> local_118;
  undefined1 local_f8 [8];
  Quat swing_q;
  double local_d0;
  double local_c8;
  undefined1 local_c0 [8];
  Vector3 swing_p;
  Quat waist_rot;
  Quat foot_rot;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  undefined1 local_48 [8];
  Vector3 next_land_distance;
  Scalar local_28 [3];
  PlanFootprints *local_10;
  PlanFootprints *this_local;
  
  local_10 = this;
  whichWalkOrStep(this);
  if ((calcNextFootprintOld()::before_land_pos == '\0') &&
     (iVar5 = __cxa_guard_acquire(&calcNextFootprintOld()::before_land_pos), iVar5 != 0)) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x2e8));
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x2e8));
    local_28[0] = 0.0;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              (&calcNextFootprintOld::before_land_pos,pSVar6,pSVar7,local_28);
    __cxa_guard_release(&calcNextFootprintOld()::before_land_pos);
  }
  if ((calcNextFootprintOld()::before_land_dis == '\0') &&
     (iVar5 = __cxa_guard_acquire(&calcNextFootprintOld()::before_land_dis), iVar5 != 0)) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x2e8));
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x2e8));
    next_land_distance.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
    .array[2] = 0.0;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              (&calcNextFootprintOld::before_land_dis,pSVar6,pSVar7,
               next_land_distance.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array + 2);
    __cxa_guard_release(&calcNextFootprintOld()::before_land_dis);
  }
  local_50 = 0.0;
  local_58 = 0.0;
  local_60 = 0.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_48,&local_50,&local_58,&local_60);
  if (((*(int *)(this + 0x308) == 6) || (*(int *)(this + 0x308) == 7)) ||
     (*(int *)(this + 0x308) == 9)) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x2e8));
    SVar1 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_48,0);
    *pSVar6 = SVar1;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x2e8));
    bVar4 = isCollisionLegs(this,*pSVar6);
    if (bVar4) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x2e8)
                         );
      local_150 = *pSVar6;
    }
    else {
      local_150 = 0.0;
    }
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_48,1);
    *pSVar6 = local_150;
  }
  else if (*(int *)(this + 0x308) == 5) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x2e8));
    SVar1 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_48,0);
    *pSVar6 = SVar1;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        &calcNextFootprintOld::before_land_pos);
    bVar4 = isCollisionLegs(this,*pSVar6);
    if (bVar4) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          &calcNextFootprintOld::before_land_pos);
      local_168 = *pSVar6;
    }
    else {
      local_168 = 0.0;
    }
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_48,1);
    *pSVar6 = local_168;
  }
  else if (*(int *)(this + 0x308) == 8) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        &calcNextFootprintOld::before_land_pos);
    SVar1 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_48,0);
    *pSVar6 = SVar1;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        &calcNextFootprintOld::before_land_pos);
    bVar4 = isCollisionLegs(this,*pSVar6);
    if (bVar4) {
      local_180 = 0.0;
    }
    else {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          &calcNextFootprintOld::before_land_pos);
      local_180 = *pSVar6;
    }
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_48,1);
    *pSVar6 = local_180;
  }
  else if (*(int *)(this + 0x308) == 1) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        &calcNextFootprintOld::before_land_pos);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x2e8));
    dVar2 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        &calcNextFootprintOld::before_land_pos);
    dVar3 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_48,0);
    *pSVar6 = dVar9 + dVar9 + (dVar2 - dVar3);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x2e8));
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        &calcNextFootprintOld::before_land_dis);
    dVar9 = isCollisionLegs(this,dVar9,*pSVar6);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_48,1);
    *pSVar6 = dVar9;
  }
  else {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_48,0);
    *pSVar6 = 0.0;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_48,1);
    *pSVar6 = 0.0;
  }
  rpy2q((Quat *)(waist_rot.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array + 3),0.0,0.0,*(double *)(this + 0x300));
  rpy2q((Quat *)(swing_p.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array + 2),0.0,0.0,*(double *)(this + 0x300) * 0.5);
  pDVar8 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           Pose::p((Pose *)(this + (ulong)*(uint *)(this + 0x2e0) * 0xe0 + 0x10));
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x(pDVar8);
  dVar9 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_48,0);
  local_c8 = dVar9 + *pSVar6;
  pDVar8 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           Pose::p((Pose *)(this + (ulong)*(uint *)(this + 0x2e0) * 0xe0 + 0x10));
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y(pDVar8);
  dVar9 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_48,1);
  local_d0 = dVar9 + *pSVar6;
  pDVar8 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           Pose::p((Pose *)(this + (ulong)*(uint *)(this + 0x2e0) * 0xe0 + 0x310));
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::z(pDVar8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_c0,&local_c8,&local_d0,pSVar6);
  this_00 = (QuaternionBase<Eigen::Quaternion<double,0>> *)
            Pose::q((Pose *)(this + (ulong)*(uint *)(this + 0x2e0) * 0xe0 + 0x10));
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            ((Quaternion<double,_0> *)local_f8,this_00,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
             (waist_rot.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 3));
  Pose::set((Pose *)(this + (ulong)*(uint *)(this + 0x2e0) * 0xe0 + 0x10),(Vector3 *)local_c0,
            (Quat *)local_f8);
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            (&local_118,(QuaternionBase<Eigen::Quaternion<double,0>> *)(this + 0x2b0),
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
             (swing_p.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Quaternion<double,_0>::operator=((Quaternion<double,_0> *)(this + 0x2b0),&local_118);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            (&calcNextFootprintOld::before_land_pos,(Matrix<double,_3,_1,_0,_3,_1> *)(this + 0x2e8))
  ;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            (&calcNextFootprintOld::before_land_dis,(Matrix<double,_3,_1,_0,_3,_1> *)local_48);
  return;
}

Assistant:

void PlanFootprints::calcNextFootprintOld() {
  whichWalkOrStep();
  static Vector3 before_land_pos(step_vector.x(), step_vector.y(), 0.0);
  static Vector3 before_land_dis(step_vector.x(), step_vector.y(), 0.0);

  // calc next step land position
  Vector3 next_land_distance(0.0, 0.0, 0.0);
  if (wstate == starting1 || wstate == starting2 || wstate == step2walk) {
    next_land_distance[0] = step_vector.x();
    next_land_distance[1] = isCollisionLegs(step_vector.y()) ? step_vector.y() : 0.0;
  } else if (wstate == stop_next) {  // walking stop
    next_land_distance[0] = step_vector.x();
    next_land_distance[1] =
        isCollisionLegs(before_land_pos.y()) ? before_land_pos.y() : 0.0;
  } else if (wstate == walk2step) {  // walk -> step
    next_land_distance[0] = before_land_pos.x();
    next_land_distance[1] =
        isCollisionLegs(before_land_pos.y()) ? 0.0 : before_land_pos.y();
  } else if (wstate == walk) {
    next_land_distance[0] =
        before_land_pos.x() * 2 + (step_vector.x() - before_land_pos.x());
    next_land_distance[1] = isCollisionLegs(step_vector.y(), before_land_dis.y());
  } else {
    next_land_distance[0] = 0.0;
    next_land_distance[1] = 0.0;
  }

  // calc next step land rotation
  Quat foot_rot = rpy2q(0.0, 0.0, step_angle);
  Quat waist_rot = rpy2q(0.0, 0.0, step_angle * 0.5);

  // swing leg
  Vector3 swing_p(
      ref_land_pose[swingleg].p().x() + next_land_distance[0],
      ref_land_pose[swingleg].p().y() + next_land_distance[1],
      init_feet_pose[swingleg].p().z());
  Quat swing_q = ref_land_pose[swingleg].q() * foot_rot;

  // set next landing position
  ref_land_pose[swingleg].set(swing_p, swing_q);
  ref_waist_r = ref_waist_r * waist_rot;

  before_land_pos = step_vector;
  before_land_dis = next_land_distance;
}